

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O2

uint32_t sysbvm_integer_sumInto
                   (size_t leftWordCount,uint32_t *leftWords,size_t rightWordCount,
                   uint32_t *rightWords,size_t resultWordCount,uint32_t *resultWords)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  size_t i_1;
  size_t sVar4;
  size_t i;
  ulong uVar5;
  ulong uVar6;
  
  sVar4 = rightWordCount;
  if (rightWordCount < leftWordCount) {
    sVar4 = leftWordCount;
  }
  uVar1 = 0;
  for (uVar5 = 0; sVar4 != uVar5; uVar5 = uVar5 + 1) {
    if (uVar5 < leftWordCount) {
      uVar2 = (ulong)leftWords[uVar5];
    }
    else {
      uVar2 = 0;
    }
    if (uVar5 < rightWordCount) {
      uVar6 = (ulong)rightWords[uVar5];
    }
    else {
      uVar6 = 0;
    }
    lVar3 = uVar2 + uVar1 + uVar6;
    if (uVar5 < resultWordCount) {
      resultWords[uVar5] = (uint32_t)lVar3;
    }
    uVar1 = (uint)((ulong)lVar3 >> 0x20);
  }
  for (; sVar4 < resultWordCount; sVar4 = sVar4 + 1) {
    resultWords[sVar4] = uVar1;
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

static uint32_t sysbvm_integer_sumInto(size_t leftWordCount, uint32_t *leftWords, size_t rightWordCount, uint32_t *rightWords, size_t resultWordCount, uint32_t *resultWords)
{
    uint32_t carry = 0;
    
    size_t wordsToSum = leftWordCount > rightWordCount ? leftWordCount : rightWordCount;
    for(size_t i = 0; i < wordsToSum; ++i)
    {
        uint32_t leftWord = i < leftWordCount ? leftWords[i] : 0;
        uint32_t rightWord = i < rightWordCount ? rightWords[i] : 0;

        uint64_t sum = (uint64_t)leftWord + (uint64_t)rightWord + (uint64_t)carry;
        uint32_t sumWord = (uint32_t)sum;
        if(i < resultWordCount)
            resultWords[i] = sumWord;

        carry = (uint32_t)(sum >> 32);
    }

    for(size_t i = wordsToSum; i < resultWordCount; ++i)
    {
        if(i < resultWordCount)
            resultWords[i] = carry;
        carry = 0;
    }

    return carry;
}